

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O3

void Ins_MDRP(TT_ExecContext exc,FT_Long *args)

{
  ushort uVar1;
  long lVar2;
  FT_Vector *pFVar3;
  uint uVar4;
  byte bVar5;
  FT_Vector *pFVar6;
  FT_F26Dot6 FVar7;
  long lVar8;
  ulong uVar9;
  long *plVar10;
  FT_Pos FVar11;
  ulong uVar12;
  ulong uVar13;
  FT_UShort FVar14;
  FT_Pos FVar15;
  long lVar16;
  
  FVar14 = (FT_UShort)args;
  uVar4 = (uint)args;
  if (((uint)(exc->zp1).n_points <= (uVar4 & 0xffff)) ||
     (uVar1 = (exc->GS).rp0, (exc->zp0).n_points <= uVar1)) {
    if (exc->pedantic_hinting != '\0') {
      exc->error = 0x86;
    }
    goto LAB_00226d63;
  }
  uVar13 = (exc->GS).minimum_distance;
  if (((exc->GS).gep0 == 0) || ((exc->GS).gep1 == 0)) {
    pFVar6 = (exc->zp0).org;
    pFVar3 = (exc->zp1).org;
    uVar12 = (ulong)((uVar4 & 0xffff) << 4);
    FVar15 = *(long *)((long)&pFVar3->x + uVar12) - pFVar6[uVar1].x;
    FVar11 = *(long *)((long)&pFVar3->y + uVar12) - pFVar6[uVar1].y;
LAB_00226c3c:
    FVar7 = (*exc->func_dualproj)(exc,FVar15,FVar11);
  }
  else {
    plVar10 = (long *)((long)&((exc->zp1).orus)->x + (ulong)((uVar4 & 0xffff) << 4));
    pFVar6 = (exc->zp0).orus + uVar1;
    lVar8 = (exc->metrics).x_scale;
    lVar16 = (exc->metrics).y_scale;
    if (lVar8 != lVar16) {
      lVar8 = (long)(int)lVar8 * (long)((int)*plVar10 - (int)pFVar6->x);
      FVar15 = (FT_Pos)(int)((ulong)(lVar8 + 0x8000 + (lVar8 >> 0x3f)) >> 0x10);
      lVar8 = (long)(int)lVar16 * (long)((int)plVar10[1] - (int)pFVar6->y);
      FVar11 = (FT_Pos)(int)((ulong)(lVar8 + 0x8000 + (lVar8 >> 0x3f)) >> 0x10);
      goto LAB_00226c3c;
    }
    FVar7 = (*exc->func_dualproj)(exc,*plVar10 - pFVar6->x,plVar10[1] - pFVar6->y);
    lVar8 = (long)(int)FVar7 * (long)(int)(exc->metrics).x_scale;
    FVar7 = (FT_F26Dot6)(int)((ulong)(lVar8 + (lVar8 >> 0x3f) + 0x8000) >> 0x10);
  }
  lVar8 = (exc->GS).single_width_cutin;
  lVar16 = FVar7;
  if (((0 < lVar8) &&
      (lVar2 = (exc->GS).single_width_value, lVar2 - lVar8 < FVar7 && FVar7 < lVar2 + lVar8)) &&
     (lVar16 = -lVar2, -1 < FVar7)) {
    lVar16 = lVar2;
  }
  bVar5 = exc->opcode;
  if ((bVar5 & 4) == 0) {
    lVar8 = (exc->tt_metrics).compensations[bVar5 & 3];
    if (lVar16 < 0) {
      uVar12 = lVar16 - lVar8;
      uVar12 = (long)uVar12 >> 0x3f & uVar12;
    }
    else {
      uVar9 = lVar8 + lVar16;
      uVar12 = 0;
      if (0 < (long)uVar9) {
        uVar12 = uVar9;
      }
    }
  }
  else {
    uVar12 = (*exc->func_round)(exc,lVar16,(exc->tt_metrics).compensations[bVar5 & 3]);
    bVar5 = exc->opcode;
  }
  if ((bVar5 & 8) != 0) {
    if (lVar16 < 0) {
      if (SBORROW8(uVar12,-uVar13) == (long)(uVar12 + uVar13) < 0) {
        uVar12 = -uVar13;
      }
    }
    else if ((long)uVar12 <= (long)uVar13) {
      uVar12 = uVar13;
    }
  }
  pFVar6 = (exc->zp0).cur;
  pFVar3 = (exc->zp1).cur;
  uVar13 = (ulong)((uVar4 & 0xffff) << 4);
  uVar1 = (exc->GS).rp0;
  FVar7 = (*exc->func_project)
                    (exc,*(long *)((long)&pFVar3->x + uVar13) - pFVar6[uVar1].x,
                     *(long *)((long)&pFVar3->y + uVar13) - pFVar6[uVar1].y);
  (*exc->func_move)(exc,&exc->zp1,FVar14,uVar12 - FVar7);
LAB_00226d63:
  (exc->GS).rp1 = (exc->GS).rp0;
  (exc->GS).rp2 = FVar14;
  if ((exc->opcode & 0x10) != 0) {
    (exc->GS).rp0 = FVar14;
  }
  return;
}

Assistant:

static void
  Ins_MDRP( TT_ExecContext  exc,
            FT_Long*        args )
  {
    FT_UShort   point = 0;
    FT_F26Dot6  org_dist, distance, minimum_distance;


    minimum_distance = exc->GS.minimum_distance;

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
    if ( SUBPIXEL_HINTING_INFINALITY                        &&
         exc->ignore_x_mode                                 &&
         exc->GS.freeVector.x != 0                          &&
         !( exc->sph_tweak_flags & SPH_TWEAK_NORMAL_ROUND ) )
      minimum_distance = 0;
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

    point = (FT_UShort)args[0];

    if ( BOUNDS( point,       exc->zp1.n_points ) ||
         BOUNDS( exc->GS.rp0, exc->zp0.n_points ) )
    {
      if ( exc->pedantic_hinting )
        exc->error = FT_THROW( Invalid_Reference );
      goto Fail;
    }

    /* XXX: Is there some undocumented feature while in the */
    /*      twilight zone?                                  */

    /* XXX: UNDOCUMENTED: twilight zone special case */

    if ( exc->GS.gep0 == 0 || exc->GS.gep1 == 0 )
    {
      FT_Vector*  vec1 = &exc->zp1.org[point];
      FT_Vector*  vec2 = &exc->zp0.org[exc->GS.rp0];


      org_dist = DUALPROJ( vec1, vec2 );
    }
    else
    {
      FT_Vector*  vec1 = &exc->zp1.orus[point];
      FT_Vector*  vec2 = &exc->zp0.orus[exc->GS.rp0];


      if ( exc->metrics.x_scale == exc->metrics.y_scale )
      {
        /* this should be faster */
        org_dist = DUALPROJ( vec1, vec2 );
        org_dist = FT_MulFix( org_dist, exc->metrics.x_scale );
      }
      else
      {
        FT_Vector  vec;


        vec.x = FT_MulFix( SUB_LONG( vec1->x, vec2->x ),
                           exc->metrics.x_scale );
        vec.y = FT_MulFix( SUB_LONG( vec1->y, vec2->y ),
                           exc->metrics.y_scale );

        org_dist = FAST_DUALPROJ( &vec );
      }
    }

    /* single width cut-in test */

    /* |org_dist - single_width_value| < single_width_cutin */
    if ( exc->GS.single_width_cutin > 0          &&
         org_dist < exc->GS.single_width_value +
                      exc->GS.single_width_cutin &&
         org_dist > exc->GS.single_width_value -
                      exc->GS.single_width_cutin )
    {
      if ( org_dist >= 0 )
        org_dist = exc->GS.single_width_value;
      else
        org_dist = -exc->GS.single_width_value;
    }

    /* round flag */

    if ( ( exc->opcode & 4 ) != 0 )
    {
#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
      if ( SUBPIXEL_HINTING_INFINALITY &&
           exc->ignore_x_mode          &&
           exc->GS.freeVector.x != 0   )
        distance = Round_None(
                     exc,
                     org_dist,
                     exc->tt_metrics.compensations[exc->opcode & 3] );
      else
#endif
        distance = exc->func_round(
                     exc,
                     org_dist,
                     exc->tt_metrics.compensations[exc->opcode & 3] );
    }
    else
      distance = Round_None(
                   exc,
                   org_dist,
                   exc->tt_metrics.compensations[exc->opcode & 3] );

    /* minimum distance flag */

    if ( ( exc->opcode & 8 ) != 0 )
    {
      if ( org_dist >= 0 )
      {
        if ( distance < minimum_distance )
          distance = minimum_distance;
      }
      else
      {
        if ( distance > NEG_LONG( minimum_distance ) )
          distance = NEG_LONG( minimum_distance );
      }
    }

    /* now move the point */

    org_dist = PROJECT( exc->zp1.cur + point, exc->zp0.cur + exc->GS.rp0 );

    exc->func_move( exc, &exc->zp1, point, SUB_LONG( distance, org_dist ) );

  Fail:
    exc->GS.rp1 = exc->GS.rp0;
    exc->GS.rp2 = point;

    if ( ( exc->opcode & 16 ) != 0 )
      exc->GS.rp0 = point;
  }